

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O1

size_t ssh_sendbuffer(Backend *be)

{
  size_t sVar1;
  long lVar2;
  
  if ((be[-3].vt == (BackendVtable *)0x0) || (be[0x19].interactor == (Interactor *)0x0)) {
    sVar1 = 0;
  }
  else {
    sVar1 = (*(code *)(be[0x19].interactor)->parent[5].last_to_talk)();
    if (be[0x19].vt != (BackendVtable *)0x0) {
      lVar2 = (**(code **)((be[0x19].vt)->init + 0x28))();
      sVar1 = sVar1 + lVar2;
    }
    if (*(char *)&be[0xb].vt == '\x01') {
      sVar1 = (long)&(be[10].interactor)->vt + sVar1;
    }
  }
  return sVar1;
}

Assistant:

static size_t ssh_sendbuffer(Backend *be)
{
    Ssh *ssh = container_of(be, Ssh, backend);
    size_t backlog;

    if (!ssh || !ssh->s || !ssh->cl)
        return 0;

    backlog = ssh_stdin_backlog(ssh->cl);

    if (ssh->base_layer)
        backlog += ssh_ppl_queued_data_size(ssh->base_layer);

    /*
     * If the SSH socket itself has backed up, add the total backup
     * size on that to any individual buffer on the stdin channel.
     */
    if (ssh->throttled_all)
        backlog += ssh->overall_bufsize;

    return backlog;
}